

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c-wrapper.h
# Opt level: O1

string * __thiscall
wasm::generateWasm2CWrapper_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Module *wasm)

{
  Type *this_00;
  ulong uVar1;
  long *plVar2;
  long lVar3;
  wasm *this_01;
  size_t sVar4;
  char cVar5;
  long *plVar6;
  Type *pTVar7;
  Type TVar8;
  long *plVar9;
  size_t *psVar10;
  undefined8 *puVar11;
  ulong extraout_RDX;
  char cVar12;
  ulong uVar13;
  char *__assertion;
  Type in_R9;
  long *plVar14;
  size_type *psVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  Name NVar18;
  Name name;
  Signature sig;
  undefined1 local_240 [8];
  Iterator __begin2;
  Type local_a0;
  Type result;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  size_type *local_70;
  string __str;
  long local_40;
  long lStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "\n#include <inttypes.h>\n#include <stdint.h>\n#include <stdio.h>\n\n#include \"wasm-rt-impl.h\"\n#include \"wasm.h\"\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi(u32 x) {\n  printf(\"[LoggingExternalInterface logging %d]\\n\", x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi)(u32) = _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj(u64 x) {\n  printf(\"[LoggingExternalInterface logging %\" PRId64 \"]\\n\", (int64_t)x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj)(u64) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii(u32 x, u32 y) {\n  printf(\"[LoggingExternalInterface logging %d %d]\\n\", x, y);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii)(u32, u32) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf(f32 x) {\n  printf(\"[LoggingExternalInterface logging %.17e]\\n\", x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf)(f32) = _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf;\n\nvoid _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd(f64 x) {\n  printf(\"[LoggingExternalInterface logging %.17le]\\n\", x);\n}\nvoid (*Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd)(f64) = _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd;\n\n// Miscellaneous imports\n\nu32 tempRet0 = 0;\n\nvoid _Z_envZ_setTempRet0Z_vi(u32 x) {\n  tempRet0 = x;\n}\nvoid (*Z_envZ_setTempRet0Z_vi)(u32) = _Z_envZ_setTempRet0Z_vi;\n\nu32 _Z_envZ_getTempRet0Z_iv(void) {\n  return tempRet0;\n}\nu32 (*Z_envZ_getTempRet0Z_iv)(void) = _Z_envZ_getTempRet0Z_iv;\n\n// Main\n\nint main(int argc, char** argv) {\n  init();\n\n  // We go through each export and call it, in turn. Note that we use a loop\n  // so we can do all this with a single setjmp. A setjmp is needed to handle\n  // wasm traps, and emitting a single one helps compilation speed into wasm as\n  // compile times are O(size * num_setjmps).\n  for (size_t curr = 0;; curr++) {\n  "
             ,"");
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  plVar14 = *(long **)this;
  plVar2 = *(long **)(this + 8);
  if (plVar14 != plVar2) {
    result.id = 0;
    do {
      psVar15 = &__str._M_string_length;
      if (*(int *)(*plVar14 + 0x10) == 0) {
        cVar12 = '\x01';
        if (9 < result.id) {
          TVar8.id = result.id;
          cVar5 = '\x04';
          do {
            cVar12 = cVar5;
            if (TVar8.id < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_001a8fe7;
            }
            if (TVar8.id < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_001a8fe7;
            }
            if (TVar8.id < 10000) goto LAB_001a8fe7;
            bVar16 = 99999 < TVar8.id;
            TVar8.id = TVar8.id / 10000;
            cVar5 = cVar12 + '\x04';
          } while (bVar16);
          cVar12 = cVar12 + '\x01';
        }
LAB_001a8fe7:
        local_70 = psVar15;
        std::__cxx11::string::_M_construct((ulong)&local_70,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_70,(uint)__str._M_dataplus._M_p,result.id);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1df071);
        __str.field_2._8_8_ = &local_40;
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_40 = *plVar9;
          lStack_38 = plVar6[3];
        }
        else {
          local_40 = *plVar9;
          __str.field_2._8_8_ = (long *)*plVar6;
        }
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
        local_240 = (undefined1  [8])
                    &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index;
        psVar10 = (size_t *)(plVar6 + 2);
        if ((size_t *)*plVar6 == psVar10) {
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               *psVar10;
        }
        else {
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               *psVar10;
          local_240 = (undefined1  [8])*plVar6;
        }
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_240);
        if (local_240 !=
            (undefined1  [8])
            &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
          operator_delete((void *)local_240,
                          __begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                          + 1);
        }
        if ((long *)__str.field_2._8_8_ != &local_40) {
          operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
        }
        if (local_70 != psVar15) {
          operator_delete(local_70,__str._M_string_length + 1);
        }
        puVar11 = (undefined8 *)(*plVar14 + 0x18);
        if (*(char *)(*plVar14 + 0x28) != '\0') {
          puVar11 = (undefined8 *)0x0;
        }
        NVar18.super_IString.str._M_str = (char *)*puVar11;
        NVar18.super_IString.str._M_len = (size_t)this;
        ::wasm::Module::getFunction(NVar18);
        local_70 = psVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"          puts(\"[fuzz-exec] calling ","");
        lVar3 = ((long *)*plVar14)[1];
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,lVar3,*(long *)*plVar14 + lVar3);
        uVar13 = 0xf;
        if (local_70 != psVar15) {
          uVar13 = __str._M_string_length;
        }
        uVar1 = local_88 + CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p);
        if (uVar13 < uVar1) {
          uVar13 = 0xf;
          if (local_90 != local_80) {
            uVar13 = local_80[0];
          }
          if (uVar13 < uVar1) goto LAB_001a91d7;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
        }
        else {
LAB_001a91d7:
          puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90)
          ;
        }
        __str.field_2._8_8_ = &local_40;
        plVar6 = puVar11 + 2;
        if ((long *)*puVar11 == plVar6) {
          local_40 = *plVar6;
          lStack_38 = puVar11[3];
        }
        else {
          local_40 = *plVar6;
          __str.field_2._8_8_ = (long *)*puVar11;
        }
        *puVar11 = plVar6;
        puVar11[1] = 0;
        *(undefined1 *)plVar6 = 0;
        plVar6 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
        local_240 = (undefined1  [8])
                    &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index;
        psVar10 = (size_t *)(plVar6 + 2);
        if ((size_t *)*plVar6 == psVar10) {
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               *psVar10;
        }
        else {
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               *psVar10;
          local_240 = (undefined1  [8])*plVar6;
        }
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_240);
        if (local_240 !=
            (undefined1  [8])
            &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
          operator_delete((void *)local_240,
                          __begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                          + 1);
        }
        if ((long *)__str.field_2._8_8_ != &local_40) {
          operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if (local_70 != psVar15) {
          operator_delete(local_70,__str._M_string_length + 1);
        }
        ::wasm::HeapType::getSignature();
        local_a0.id = extraout_RDX;
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (local_a0.id != 0) {
          local_70 = psVar15;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"printf(\"[fuzz-exec] note result: ","");
          lVar3 = ((long *)*plVar14)[1];
          local_90 = local_80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,lVar3,*(long *)*plVar14 + lVar3);
          uVar13 = 0xf;
          if (local_70 != psVar15) {
            uVar13 = __str._M_string_length;
          }
          uVar1 = local_88 + CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p);
          if (uVar13 < uVar1) {
            uVar13 = 0xf;
            if (local_90 != local_80) {
              uVar13 = local_80[0];
            }
            if (uVar13 < uVar1) goto LAB_001a93cc;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_001a93cc:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
          }
          __str.field_2._8_8_ = &local_40;
          plVar6 = puVar11 + 2;
          if ((long *)*puVar11 == plVar6) {
            local_40 = *plVar6;
            lStack_38 = puVar11[3];
          }
          else {
            local_40 = *plVar6;
            __str.field_2._8_8_ = (long *)*puVar11;
          }
          *puVar11 = plVar6;
          puVar11[1] = 0;
          *(undefined1 *)plVar6 = 0;
          plVar6 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
          local_240 = (undefined1  [8])
                      &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       index;
          psVar10 = (size_t *)(plVar6 + 2);
          if ((size_t *)*plVar6 == psVar10) {
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                 *psVar10;
          }
          else {
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                 *psVar10;
            local_240 = (undefined1  [8])*plVar6;
          }
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)plVar6[1];
          *plVar6 = (long)psVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_240);
          if (local_240 !=
              (undefined1  [8])
              &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
            operator_delete((void *)local_240,
                            __begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index + 1);
          }
          if ((long *)__str.field_2._8_8_ != &local_40) {
            operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
          }
          if (local_90 != local_80) {
            operator_delete(local_90,local_80[0] + 1);
          }
          if (local_70 != psVar15) {
            operator_delete(local_70,__str._M_string_length + 1);
          }
          if ((local_a0.id & 1) != 0 && 6 < local_a0.id) {
            __assertion = "!result.isTuple() && \"Unexpected tuple type\"";
LAB_001a9742:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm2c-wrapper.h"
                          ,0xab,"std::string wasm::generateWasm2CWrapper(Module &)");
          }
          if (6 < local_a0.id) {
            __assertion = "result.isBasic() && \"TODO: handle compound types\"";
            goto LAB_001a9742;
          }
          if (3 < (int)local_a0.id - 2U) {
            Fatal::Fatal((Fatal *)local_240);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index,"unhandled wasm2c wrapper result type: ",0x26);
            Fatal::operator<<((Fatal *)local_240,&local_a0);
            Fatal::~Fatal((Fatal *)local_240);
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        this_01 = *(wasm **)*plVar14;
        sVar4 = ((undefined8 *)*plVar14)[1];
        auVar17 = ::wasm::HeapType::getSignature();
        name.super_IString.str._M_str = auVar17._0_8_;
        name.super_IString.str._M_len = sVar4;
        sig.results.id = in_R9.id;
        sig.params.id = auVar17._8_8_;
        wasm2cMangle_abi_cxx11_((string *)local_240,this_01,name,sig);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_240);
        if (local_240 !=
            (undefined1  [8])
            &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
          operator_delete((void *)local_240,
                          __begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                          + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        __str.field_2._8_8_ = ::wasm::HeapType::getSignature();
        this_00 = (Type *)((long)&__str.field_2 + 8);
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        local_240 = (undefined1  [8])this_00;
        pTVar7 = (Type *)Type::size(this_00);
        if ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
             pTVar7) || (local_240 != (undefined1  [8])this_00)) {
          bVar16 = true;
          do {
            ::wasm::Type::Iterator::operator*((Iterator *)local_240);
            if (!bVar16) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin2.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1);
            bVar16 = false;
          } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    parent != pTVar7) || (local_240 != (undefined1  [8])((long)&__str.field_2 + 8)))
          ;
        }
        if (local_a0.id != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        result.id = result.id + 1;
      }
      plVar14 = plVar14 + 1;
    } while (plVar14 != plVar2);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline std::string generateWasm2CWrapper(Module& wasm) {
  // First, emit implementations of the wasm's imports so that the wasm2c code
  // can call them. The names use wasm2c's name mangling.
  std::string ret = R"(
#include <inttypes.h>
#include <stdint.h>
#include <stdio.h>

#include "wasm-rt-impl.h"
#include "wasm.h"

void _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi(u32 x) {
  printf("[LoggingExternalInterface logging %d]\n", x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi)(u32) = _Z_fuzzingZ2DsupportZ_logZ2Di32Z_vi;

void _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj(u64 x) {
  printf("[LoggingExternalInterface logging %" PRId64 "]\n", (int64_t)x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj)(u64) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vj;

void _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii(u32 x, u32 y) {
  printf("[LoggingExternalInterface logging %d %d]\n", x, y);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii)(u32, u32) = _Z_fuzzingZ2DsupportZ_logZ2Di64Z_vii;

void _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf(f32 x) {
  printf("[LoggingExternalInterface logging %.17e]\n", x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf)(f32) = _Z_fuzzingZ2DsupportZ_logZ2Df32Z_vf;

void _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd(f64 x) {
  printf("[LoggingExternalInterface logging %.17le]\n", x);
}
void (*Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd)(f64) = _Z_fuzzingZ2DsupportZ_logZ2Df64Z_vd;

// Miscellaneous imports

u32 tempRet0 = 0;

void _Z_envZ_setTempRet0Z_vi(u32 x) {
  tempRet0 = x;
}
void (*Z_envZ_setTempRet0Z_vi)(u32) = _Z_envZ_setTempRet0Z_vi;

u32 _Z_envZ_getTempRet0Z_iv(void) {
  return tempRet0;
}
u32 (*Z_envZ_getTempRet0Z_iv)(void) = _Z_envZ_getTempRet0Z_iv;

// Main

int main(int argc, char** argv) {
  init();

  // We go through each export and call it, in turn. Note that we use a loop
  // so we can do all this with a single setjmp. A setjmp is needed to handle
  // wasm traps, and emitting a single one helps compilation speed into wasm as
  // compile times are O(size * num_setjmps).
  for (size_t curr = 0;; curr++) {
  )";
  ret += R"(
    // Prepare to call the export, so we can catch traps.
    if (WASM_RT_SETJMP(g_jmp_buf) != 0) {
      puts("exception!");
    } else {
      // Call the proper export.
      switch(curr) {
)";

  // For each function export in the wasm, emit code to call it and log its
  // result, similar to the other wrappers.
  size_t functionExportIndex = 0;

  for (auto& exp : wasm.exports) {
    if (exp->kind != ExternalKind::Function) {
      continue;
    }

    ret += "        case " + std::to_string(functionExportIndex++) + ":\n";

    auto* func = wasm.getFunction(*exp->getInternalName());

    ret += std::string("          puts(\"[fuzz-exec] calling ") +
           exp->name.toString() + "\");\n";
    auto result = func->getResults();

    // Emit the call itself.
    ret += "            ";
    if (result != Type::none) {
      ret += std::string("printf(\"[fuzz-exec] note result: ") +
             exp->name.toString() + " => ";
      TODO_SINGLE_COMPOUND(result);
      switch (result.getBasic()) {
        case Type::i32:
          ret += "%d\\n\", ";
          break;
        case Type::i64:
          ret += "%\" PRId64 \"\\n\", (int64_t)";
          break;
        case Type::f32:
          ret += "%.17e\\n\", ";
          break;
        case Type::f64:
          ret += "%.17le\\n\", ";
          break;
        default:
          Fatal() << "unhandled wasm2c wrapper result type: " << result;
      }
    }

    // Call the export.
    ret += "(*";

    // Emit the callee's name with wasm2c name mangling.
    ret += wasm2cMangle(exp->name, func->getSig());

    ret += ")(";

    // Emit the parameters (all 0s, like the other wrappers).
    bool first = true;
    for ([[maybe_unused]] const auto& param : func->getParams()) {
      if (!first) {
        ret += ", ";
      }
      ret += "0";
      first = false;
    }
    if (result != Type::none) {
      ret += ")";
    }
    ret += ");\n";

    // Break from the big switch.
    ret += "          break;\n";
  }

  ret += R"(        default:
          return 0; // All done.
      }
    }
  }
  return 0;
}
)";

  return ret;
}